

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O1

CURLcode smb_send_and_recv(Curl_easy *data,void **msg)

{
  size_t *psVar1;
  dynbuf *pdVar2;
  connectdata *pcVar3;
  connectdata *pcVar4;
  size_t sVar5;
  size_t sVar6;
  bool bVar7;
  unsigned_short uVar8;
  CURLcode CVar9;
  uint uVar10;
  uint uVar11;
  char *pcVar12;
  _Bool eos;
  size_t nread;
  _Bool local_39;
  char *local_38;
  
  pcVar3 = data->conn;
  *msg = (void *)0x0;
  if (((pcVar3->proto).ftpc.pp.sendbuf.leng == 0) &&
     (pcVar12 = (pcVar3->proto).ftpc.pp.sendbuf.bufr, pcVar12 != (char *)0x0)) {
    local_38 = (char *)0x9000;
    if (pcVar12 < (char *)0x9000) {
      local_38 = pcVar12;
    }
    CVar9 = Curl_client_read(data,(pcVar3->proto).smbc.send_buf,(size_t)local_38,(size_t *)&local_38
                             ,&local_39);
    if ((CVar9 == CURLE_AGAIN) || (CVar9 == CURLE_OK)) {
      if (local_38 == (char *)0x0) {
        bVar7 = false;
        CVar9 = CURLE_OK;
      }
      else {
        pdVar2 = &(pcVar3->proto).ftpc.pp.sendbuf;
        pdVar2->bufr = pdVar2->bufr + -(long)local_38;
        (pcVar3->proto).ftpc.pp.sendbuf.leng = (size_t)local_38;
        (pcVar3->proto).ftpc.pp.sendbuf.allc = 0;
        bVar7 = true;
        CVar9 = CURLE_OK;
      }
    }
    else {
      bVar7 = false;
    }
    if (!bVar7) {
      return CVar9;
    }
  }
  if ((pcVar3->proto).ftpc.pp.sendbuf.leng == 0) goto LAB_00156e7c;
  pcVar4 = data->conn;
  sVar5 = (pcVar4->proto).ftpc.pp.sendbuf.leng;
  if (sVar5 == 0) {
LAB_00156e72:
    CVar9 = CURLE_OK;
  }
  else {
    sVar6 = (pcVar4->proto).ftpc.pp.sendbuf.allc;
    pcVar12 = (char *)(sVar5 - sVar6);
    CVar9 = Curl_xfer_send(data,(pcVar4->proto).smbc.send_buf + sVar6,(size_t)pcVar12,false,
                           (size_t *)&local_38);
    if (CVar9 == CURLE_OK) {
      if (local_38 == pcVar12) {
        (pcVar4->proto).ftpc.pp.sendbuf.leng = 0;
      }
      else {
        psVar1 = &(pcVar4->proto).ftpc.pp.sendbuf.allc;
        *psVar1 = (size_t)(local_38 + *psVar1);
      }
      goto LAB_00156e72;
    }
  }
  if (CVar9 != CURLE_OK) {
    return CVar9;
  }
LAB_00156e7c:
  CVar9 = CURLE_AGAIN;
  if (((pcVar3->proto).ftpc.pp.sendbuf.leng == 0) &&
     ((pcVar3->proto).ftpc.pp.sendbuf.bufr == (char *)0x0)) {
    pcVar3 = data->conn;
    pcVar12 = (pcVar3->proto).smbc.recv_buf;
    sVar5 = (pcVar3->proto).ftpc.pp.sendbuf.toobig;
    CVar9 = Curl_xfer_recv(data,pcVar12 + sVar5,0x9000 - sVar5,(ssize_t *)&local_38);
    if ((CVar9 == CURLE_OK) &&
       ((CVar9 = CURLE_OK, local_38 != (char *)0x0 &&
        (sVar5 = (pcVar3->proto).ftpc.pp.sendbuf.toobig,
        (pcVar3->proto).ftpc.pp.sendbuf.toobig = (size_t)(local_38 + sVar5),
        (char *)0x3 < local_38 + sVar5)))) {
      uVar8 = Curl_read16_be((uchar *)(pcVar12 + 2));
      if ((ulong)uVar8 + 4 <= (pcVar3->proto).ftpc.pp.sendbuf.toobig) {
        if (0x20 < uVar8) {
          uVar10 = (uint)(byte)pcVar12[0x24] * 2 + 0x27;
          uVar11 = (uint)((ulong)uVar8 + 4);
          if ((uVar10 <= uVar11) &&
             (uVar8 = Curl_read16_le((uchar *)(pcVar12 +
                                              (ulong)((uint)(byte)pcVar12[0x24] * 2) + 0x25)),
             uVar11 < uVar10 + uVar8)) {
            return CURLE_READ_ERROR;
          }
        }
        *msg = pcVar12;
        CVar9 = CURLE_OK;
      }
    }
  }
  return CVar9;
}

Assistant:

static CURLcode smb_send_and_recv(struct Curl_easy *data, void **msg)
{
  struct connectdata *conn = data->conn;
  struct smb_conn *smbc = &conn->proto.smbc;
  CURLcode result;
  *msg = NULL; /* if it returns early */

  /* Check if there is data in the transfer buffer */
  if(!smbc->send_size && smbc->upload_size) {
    size_t nread = smbc->upload_size > (size_t)MAX_MESSAGE_SIZE ?
      (size_t)MAX_MESSAGE_SIZE : smbc->upload_size;
    bool eos;

    result = Curl_client_read(data, smbc->send_buf, nread, &nread, &eos);
    if(result && result != CURLE_AGAIN)
      return result;
    if(!nread)
      return CURLE_OK;

    smbc->upload_size -= nread;
    smbc->send_size = nread;
    smbc->sent = 0;
  }

  /* Check if there is data to send */
  if(smbc->send_size) {
    result = smb_flush(data);
    if(result)
      return result;
  }

  /* Check if there is still data to be sent */
  if(smbc->send_size || smbc->upload_size)
    return CURLE_AGAIN;

  return smb_recv_message(data, msg);
}